

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void WindowSettingsHandler_WriteAll
               (ImGuiContext *ctx,ImGuiSettingsHandler *handler,ImGuiTextBuffer *buf)

{
  int iVar1;
  ImGuiWindow *pIVar2;
  char *pcVar3;
  short sVar4;
  int iVar5;
  ImGuiWindowSettings *pIVar6;
  char *pcVar7;
  int i;
  ulong uVar8;
  
  for (uVar8 = 0; uVar8 != (uint)(ctx->Windows).Size; uVar8 = uVar8 + 1) {
    pIVar2 = (ctx->Windows).Data[uVar8];
    if ((pIVar2->Flags & 0x100) == 0) {
      if ((long)pIVar2->SettingsOffset == -1) {
        pIVar6 = ImGui::FindWindowSettings(pIVar2->ID);
      }
      else {
        pIVar6 = (ImGuiWindowSettings *)((ctx->SettingsWindows).Buf.Data + pIVar2->SettingsOffset);
      }
      if (pIVar6 == (ImGuiWindowSettings *)0x0) {
        pIVar6 = ImGui::CreateNewWindowSettings(pIVar2->Name);
        pIVar2->SettingsOffset = (int)pIVar6 - *(int *)&(ctx->SettingsWindows).Buf.Data;
      }
      pIVar6->Pos = (ImVec2ih)
                    ((int)((pIVar2->Pos).x - (pIVar2->ViewportPos).x) & 0xffffU |
                    (int)((pIVar2->Pos).y - (pIVar2->ViewportPos).y) << 0x10);
      pIVar6->Size = (ImVec2ih)
                     ((int)(pIVar2->SizeFull).x & 0xffffU | (int)(pIVar2->SizeFull).y << 0x10);
      pIVar6->ViewportId = pIVar2->ViewportId;
      pIVar6->ViewportPos =
           (ImVec2ih)((int)(pIVar2->ViewportPos).x & 0xffffU | (int)(pIVar2->ViewportPos).y << 0x10)
      ;
      pIVar6->DockId = pIVar2->DockId;
      pIVar6->ClassId = (pIVar2->WindowClass).ClassId;
      pIVar6->DockOrder = pIVar2->DockOrder;
      pIVar6->Collapsed = pIVar2->Collapsed;
    }
  }
  iVar1 = (buf->Buf).Size;
  iVar5 = iVar1 + -1;
  if (iVar1 == 0) {
    iVar5 = 0;
  }
  ImVector<char>::reserve(&buf->Buf,(ctx->SettingsWindows).Buf.Size * 6 + iVar5);
  pcVar3 = (ctx->SettingsWindows).Buf.Data;
  pcVar7 = pcVar3 + 4;
  if (pcVar3 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  do {
    if (pcVar7 == (char *)0x0) {
      return;
    }
    ImGuiTextBuffer::appendf(buf,"[%s][%s]\n",handler->TypeName,pcVar7 + 0x20);
    if ((*(int *)(pcVar7 + 0x10) != 0) && (*(int *)(pcVar7 + 0x10) != 0x11111111)) {
      ImGuiTextBuffer::appendf
                (buf,"ViewportPos=%d,%d\n",(ulong)(uint)(int)*(short *)(pcVar7 + 0xc),
                 (ulong)(uint)(int)*(short *)(pcVar7 + 0xe));
      ImGuiTextBuffer::appendf(buf,"ViewportId=0x%08X\n",(ulong)*(uint *)(pcVar7 + 0x10));
    }
    sVar4 = *(short *)(pcVar7 + 6);
    if (sVar4 == 0 && *(short *)(pcVar7 + 4) == 0) {
      if (*(int *)(pcVar7 + 0x10) == 0x11111111) {
        sVar4 = 0;
        goto LAB_0014dd15;
      }
    }
    else {
LAB_0014dd15:
      ImGuiTextBuffer::appendf
                (buf,"Pos=%d,%d\n",(ulong)(uint)(int)*(short *)(pcVar7 + 4),(ulong)(uint)(int)sVar4)
      ;
    }
    if (*(short *)(pcVar7 + 8) != 0 || *(short *)(pcVar7 + 10) != 0) {
      ImGuiTextBuffer::appendf
                (buf,"Size=%d,%d\n",(ulong)(uint)(int)*(short *)(pcVar7 + 8),
                 (ulong)(uint)(int)*(short *)(pcVar7 + 10));
    }
    ImGuiTextBuffer::appendf(buf,"Collapsed=%d\n",(ulong)(byte)pcVar7[0x1e]);
    if (*(int *)(pcVar7 + 0x14) != 0) {
      if (*(short *)(pcVar7 + 0x1c) == -1) {
        ImGuiTextBuffer::appendf(buf,"DockId=0x%08X\n");
      }
      else {
        ImGuiTextBuffer::appendf(buf,"DockId=0x%08X,%d\n");
      }
      if (*(int *)(pcVar7 + 0x18) != 0) {
        ImGuiTextBuffer::appendf(buf,"ClassId=0x%08X\n");
      }
    }
    ImGuiTextBuffer::append(buf,"\n",(char *)0x0);
    pcVar7 = pcVar7 + *(int *)(pcVar7 + -4);
    if (pcVar7 == (ctx->SettingsWindows).Buf.Data + (long)(ctx->SettingsWindows).Buf.Size + 4) {
      pcVar7 = (char *)0x0;
    }
  } while( true );
}

Assistant:

static void WindowSettingsHandler_WriteAll(ImGuiContext* ctx, ImGuiSettingsHandler* handler, ImGuiTextBuffer* buf)
{
    // Gather data from windows that were active during this session
    // (if a window wasn't opened in this session we preserve its settings)
    ImGuiContext& g = *ctx;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Flags & ImGuiWindowFlags_NoSavedSettings)
            continue;

        ImGuiWindowSettings* settings = (window->SettingsOffset != -1) ? g.SettingsWindows.ptr_from_offset(window->SettingsOffset) : ImGui::FindWindowSettings(window->ID);
        if (!settings)
        {
            settings = ImGui::CreateNewWindowSettings(window->Name);
            window->SettingsOffset = g.SettingsWindows.offset_from_ptr(settings);
        }
        IM_ASSERT(settings->ID == window->ID);
        settings->Pos = ImVec2ih(window->Pos - window->ViewportPos);
        settings->Size = ImVec2ih(window->SizeFull);
        settings->ViewportId = window->ViewportId;
        settings->ViewportPos = ImVec2ih(window->ViewportPos);
        IM_ASSERT(window->DockNode == NULL || window->DockNode->ID == window->DockId);
        settings->DockId = window->DockId;
        settings->ClassId = window->WindowClass.ClassId;
        settings->DockOrder = window->DockOrder;
        settings->Collapsed = window->Collapsed;
    }

    // Write to text buffer
    buf->reserve(buf->size() + g.SettingsWindows.size() * 6); // ballpark reserve
    for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
    {
        const char* settings_name = settings->GetName();
        buf->appendf("[%s][%s]\n", handler->TypeName, settings_name);
        if (settings->ViewportId != 0 && settings->ViewportId != ImGui::IMGUI_VIEWPORT_DEFAULT_ID)
        {
            buf->appendf("ViewportPos=%d,%d\n", settings->ViewportPos.x, settings->ViewportPos.y);
            buf->appendf("ViewportId=0x%08X\n", settings->ViewportId);
        }
        if (settings->Pos.x != 0 || settings->Pos.y != 0 || settings->ViewportId == ImGui::IMGUI_VIEWPORT_DEFAULT_ID)
            buf->appendf("Pos=%d,%d\n", settings->Pos.x, settings->Pos.y);
        if (settings->Size.x != 0 || settings->Size.y != 0)
            buf->appendf("Size=%d,%d\n", settings->Size.x, settings->Size.y);
        buf->appendf("Collapsed=%d\n", settings->Collapsed);
        if (settings->DockId != 0)
        {
            // Write DockId as 4 digits if possible. Automatic DockId are small numbers, but full explicit DockSpace() are full ImGuiID range.
            if (settings->DockOrder == -1)
                buf->appendf("DockId=0x%08X\n", settings->DockId);
            else
                buf->appendf("DockId=0x%08X,%d\n", settings->DockId, settings->DockOrder);
            if (settings->ClassId != 0)
                buf->appendf("ClassId=0x%08X\n", settings->ClassId);
        }
        buf->append("\n");
    }
}